

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O1

int * immutable::transient_rrb_nth<int,false,6>
                (ref<immutable::transient_rrb<int,_false,_6>_> *trrb,uint32_t index)

{
  long lVar1;
  int *piVar2;
  leaf_node<int,_false> *plVar3;
  uint uVar4;
  uint32_t uVar5;
  char *__function;
  uint uVar6;
  long *plVar7;
  ref<immutable::rrb<int,_false,_6>_> local_18;
  
  rrb_details::check_transience<int,false,6>(trrb);
  local_18.ptr = (rrb<int,_false,_6> *)trrb->ptr;
  if ((transient_rrb<int,_false,_6> *)local_18.ptr == (transient_rrb<int,_false,_6> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
LAB_0014f5a6:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  ((transient_rrb<int,_false,_6> *)local_18.ptr)->_ref_count =
       ((transient_rrb<int,_false,_6> *)local_18.ptr)->_ref_count + 1;
  if (((transient_rrb<int,_false,_6> *)local_18.ptr)->cnt <= index) {
    __assert_fail("index < rrb->cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x7c3,
                  "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
                 );
  }
  uVar6 = ((transient_rrb<int,_false,_6> *)local_18.ptr)->cnt -
          ((transient_rrb<int,_false,_6> *)local_18.ptr)->tail_len;
  uVar4 = index - uVar6;
  if (index < uVar6) {
    plVar3 = (leaf_node<int,_false> *)(((transient_rrb<int,_false,_6> *)local_18.ptr)->root).ptr;
    for (uVar5 = ((transient_rrb<int,_false,_6> *)local_18.ptr)->shift; uVar5 != 0;
        uVar5 = uVar5 - 6) {
      uVar4 = index >> ((byte)uVar5 & 0x1f);
      if ((long *)plVar3->child == (long *)0x0) {
        plVar7 = (long *)((ulong)((uVar4 & 0x3f) << 3) + *(long *)(plVar3 + 1));
      }
      else {
        lVar1 = *(long *)plVar3->child;
        do {
          uVar6 = uVar4;
          uVar4 = uVar6 + 1;
        } while (*(uint *)(lVar1 + (ulong)uVar6 * 4) <= index);
        if (uVar6 + 1 != 1) {
          index = index - *(int *)(lVar1 + (ulong)(uVar6 - 1) * 4);
        }
        plVar7 = (long *)((ulong)uVar6 * 8 + *(long *)(plVar3 + 1));
      }
      plVar3 = (leaf_node<int,_false> *)*plVar7;
    }
    uVar4 = index & 0x3f;
  }
  else {
    plVar3 = (((transient_rrb<int,_false,_6> *)local_18.ptr)->tail).ptr;
    if (plVar3 == (leaf_node<int,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
      ;
      goto LAB_0014f5a6;
    }
  }
  piVar2 = plVar3->child;
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_18);
  return piVar2 + uVar4;
}

Assistant:

inline const T& transient_rrb_nth(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, uint32_t index)
    {
    using namespace rrb_details;
    check_transience(trrb);
    return rrb_nth((const ref<rrb<T, atomic_ref_counting, N>>&)trrb, index);
    }